

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

void Gia_ManSweepComputeOneDomainEquivs
               (Gia_Man_t *p,Vec_Int_t *vRegClasses,int iDom,void *pParsS,int fConst,int fEquiv,
               int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Man_t *p_01;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  
  uVar1 = vRegClasses->nSize;
  if ((ulong)uVar1 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = *vRegClasses->pArray;
    if (1 < (int)uVar1) {
      uVar8 = 1;
      do {
        iVar2 = vRegClasses->pArray[uVar8];
        if (iVar4 <= iVar2) {
          iVar4 = iVar2;
        }
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
  }
  if ((iDom < 1) || (iVar4 < iDom)) {
    __assert_fail("iDom >= 1 && iDom <= nDoms",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x265,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x266,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  uVar1 = p->nRegs;
  if ((int)uVar1 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x267,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0x10 < uVar1) {
    uVar8 = (ulong)uVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = (int)uVar8;
  piVar5 = (int *)malloc(uVar8 << 2);
  p_00->pArray = piVar5;
  if (0 < vRegClasses->nSize) {
    lVar7 = 0;
    do {
      if (vRegClasses->pArray[lVar7] != iDom) {
        Vec_IntPush(p_00,(int)lVar7);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vRegClasses->nSize);
  }
  iVar4 = p_00->nSize;
  if (0 < vRegClasses->nSize) {
    lVar7 = 0;
    do {
      if (vRegClasses->pArray[lVar7] == iDom) {
        Vec_IntPush(p_00,(int)lVar7);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vRegClasses->nSize);
  }
  iVar2 = p_00->nSize;
  if (iVar2 != p->nRegs) {
    __assert_fail("Vec_IntSize(vPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x272,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  p_01 = Gia_ManDupPermFlop(p,p_00);
  if (p_01->nObjs != p->nObjs) {
    __assert_fail("Gia_ManObjNum(pNew) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x275,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  p_01->nRegs = iVar2 - iVar4;
  if (pParsS == (void *)0x0) {
    Gia_ManSeqCleanupClasses(p_01,fConst,fEquiv,fVerbose);
  }
  else {
    Cec_ManLSCorrespondenceClasses(p_01,(Cec_ParCor_t *)pParsS);
  }
  p_01->nRegs = p->nRegs;
  uVar1 = p->nObjs;
  if ((0 < (int)uVar1) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    puVar6 = &p->pObjs->Value;
    lVar7 = 0;
    do {
      uVar3 = *puVar6;
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((uVar3 & 1) != 0) {
        __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x281,
                      "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                     );
      }
      if (p_01->nObjs <= (int)(uVar3 >> 1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      p_01->pObjs[uVar3 >> 1].Value = (uint)lVar7;
      lVar7 = lVar7 + 2;
      puVar6 = puVar6 + 3;
    } while ((ulong)uVar1 * 2 != lVar7);
  }
  Gia_ManDupRemapEquiv(p,p_01);
  Gia_ManStop(p_01);
  return;
}

Assistant:

void Gia_ManSweepComputeOneDomainEquivs( Gia_Man_t * p, Vec_Int_t * vRegClasses, int iDom, void * pParsS, int fConst, int fEquiv, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vPerm;
    int i, Class, nFlops;
    int nDoms = Vec_IntFindMax(vRegClasses);
    assert( iDom >= 1 && iDom <= nDoms );
    assert( p->pManTime == NULL );
    assert( Gia_ManRegNum(p) > 0 );
    // create required flop permutation
    vPerm = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vRegClasses, Class, i )
        if ( Class != iDom )
            Vec_IntPush( vPerm, i );
    nFlops = Vec_IntSize( vPerm );
    Vec_IntForEachEntry( vRegClasses, Class, i )
        if ( Class == iDom )
            Vec_IntPush( vPerm, i );
    nFlops = Vec_IntSize(vPerm) - nFlops;
    assert( Vec_IntSize(vPerm) == Gia_ManRegNum(p) );
    // derive new AIG
    pNew = Gia_ManDupPermFlop( p, vPerm );
    assert( Gia_ManObjNum(pNew) == Gia_ManObjNum(p) );
    Vec_IntFree( vPerm );
    // perform computation of equivalences 
    pNew->nRegs = nFlops;
    if ( pParsS )
        Cec_ManLSCorrespondenceClasses( pNew, (Cec_ParCor_t *)pParsS );
    else 
        Gia_ManSeqCleanupClasses( pNew, fConst, fEquiv, fVerbose );
    pNew->nRegs = Gia_ManRegNum(p);
    // make new point to old
    Gia_ManForEachObj( p, pObj, i )
    {
        assert( !Abc_LitIsCompl(pObj->Value) );
        Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value))->Value = Abc_Var2Lit(i, 0);
    }
    // transfer
    Gia_ManDupRemapEquiv( p, pNew );
    Gia_ManStop( pNew );
}